

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

void __thiscall
absl::container_internal::
btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
::remove_values(btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
                *this,field_type i,field_type to_erase,allocator_type *alloc)

{
  int iVar1;
  byte bVar2;
  bool bVar3;
  btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
  *pbVar4;
  template_ElementType<2UL> *ptVar5;
  undefined7 in_register_00000011;
  ulong uVar6;
  ulong uVar7;
  undefined7 in_register_00000031;
  uint i_00;
  int i_01;
  
  uVar6 = CONCAT71(in_register_00000011,to_erase) & 0xffffffff;
  value_destroy_n(this,i,to_erase,alloc);
  bVar2 = finish(this);
  i_01 = (int)CONCAT71(in_register_00000031,i);
  i_00 = (int)CONCAT71(in_register_00000011,to_erase) + i_01;
  transfer_n(this,(long)(int)((uint)bVar2 - (i_00 & 0xff)),
             CONCAT71(in_register_00000031,i) & 0xffffffff,(ulong)(i_00 & 0xff),this,alloc);
  bVar3 = is_internal(this);
  uVar7 = uVar6;
  iVar1 = i_01;
  if (bVar3) {
    while( true ) {
      if ((int)uVar7 == 0) break;
      pbVar4 = child(this,iVar1 + 1);
      clear_and_delete(pbVar4,alloc);
      uVar7 = (ulong)((int)uVar7 - 1);
      iVar1 = iVar1 + 1;
    }
    while (i_01 = i_01 + 1, i_00 < bVar2) {
      i_00 = i_00 + 1;
      pbVar4 = child(this,i_00);
      set_child(this,i_01,pbVar4);
      btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>,compare_ptr,std::allocator<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>>,256,true>>
      ::GetField<4ul>((btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>,compare_ptr,std::allocator<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>>,256,true>>
                       *)this);
    }
  }
  ptVar5 = btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>,compare_ptr,std::allocator<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>>,256,true>>
           ::GetField<2ul>((btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>,compare_ptr,std::allocator<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>>,256,true>>
                            *)this);
  ptVar5[2] = bVar2 - (char)uVar6;
  return;
}

Assistant:

inline void btree_node<P>::remove_values(const field_type i,
                                         const field_type to_erase,
                                         allocator_type *alloc) {
  // Transfer values after the removed range into their new places.
  value_destroy_n(i, to_erase, alloc);
  const field_type orig_finish = finish();
  const field_type src_i = i + to_erase;
  transfer_n(orig_finish - src_i, i, src_i, this, alloc);

  if (is_internal()) {
    // Delete all children between begin and end.
    for (int j = 0; j < to_erase; ++j) {
      clear_and_delete(child(i + j + 1), alloc);
    }
    // Rotate children after end into new positions.
    for (int j = i + to_erase + 1; j <= orig_finish; ++j) {
      set_child(j - to_erase, child(j));
      clear_child(j);
    }
  }
  set_finish(orig_finish - to_erase);
}